

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int bam_cigar2rlen(int n_cigar,uint32_t *cigar)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)n_cigar;
  if (n_cigar < 1) {
    uVar2 = uVar1;
  }
  iVar3 = 0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    iVar3 = (cigar[uVar1] >> 4 &
            (int)((0x3c1a7U >> ((char)cigar[uVar1] * '\x02' & 0x1fU)) << 0x1e) >> 0x1f) + iVar3;
  }
  return iVar3;
}

Assistant:

int bam_cigar2rlen(int n_cigar, const uint32_t *cigar)
{
    int k, l;
    for (k = l = 0; k < n_cigar; ++k)
        if (bam_cigar_type(bam_cigar_op(cigar[k]))&2)
            l += bam_cigar_oplen(cigar[k]);
    return l;
}